

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O1

void PrintGraph(ExpressionGraphContext *ctx,ExprBase *expression,char *name)

{
  OutputContext *pOVar1;
  size_t sVar2;
  InplaceStr name_00;
  
  sVar2 = strlen(name);
  name_00.end = name + sVar2;
  name_00.begin = name;
  PrintGraph(ctx,expression,name_00);
  pOVar1 = ctx->output;
  if (pOVar1->outputBufPos != 0) {
    (*pOVar1->writeStream)(pOVar1->stream,pOVar1->outputBuf,pOVar1->outputBufPos);
  }
  pOVar1->outputBufPos = 0;
  return;
}

Assistant:

void PrintGraph(ExpressionGraphContext &ctx, ExprBase *expression, const char *name)
{
	PrintGraph(ctx, expression, InplaceStr(name));

	ctx.output.Flush();
}